

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_data.cpp
# Opt level: O0

Error * ot::commissioner::Ipv6PrefixFromString
                  (Error *__return_storage_ptr__,ByteArray *aPrefix,string *aStr)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  Error *aError;
  ByteArray *__x;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar5;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  anon_class_1_0_00000001 local_4f2;
  v10 local_4f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4f0;
  char *local_4e8;
  string local_4e0;
  Error local_4c0;
  ErrorCode local_494;
  string local_490;
  Error local_470;
  anon_class_1_0_00000001 local_442;
  v10 local_441;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_440;
  char *local_438;
  string local_430;
  Error local_410;
  anon_class_1_0_00000001 local_3e2;
  v10 local_3e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e0;
  char *local_3d8;
  string local_3d0;
  Error local_3b0;
  char *local_388;
  char *endPtr;
  anon_class_1_0_00000001 local_36a;
  v10 local_369;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_368;
  char *local_360;
  string local_358;
  Error local_338;
  undefined1 local_310 [8];
  Address addr;
  size_t prefixLength;
  size_t slash;
  string *aStr_local;
  ByteArray *aPrefix_local;
  Error *error;
  undefined1 local_2b8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a8;
  char *local_2a0;
  string *local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  char *pcStack_288;
  string *local_280;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_278 [2];
  undefined1 local_268 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  char *local_250;
  string *local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  char *pcStack_238;
  string *local_230;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_228 [2];
  undefined1 local_218 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  char *local_200;
  string *local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  char *pcStack_1e8;
  string *local_1e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1d8 [3];
  undefined1 local_1c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  char *local_1a8;
  string *local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  char *pcStack_190;
  string *local_188;
  v10 *local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_178;
  v10 *local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_168;
  v10 *local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_158;
  v10 *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  char *pcStack_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  char *pcStack_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  char *pcStack_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  char *pcStack_d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_c8;
  undefined1 *local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_b8;
  undefined1 *local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_a8;
  undefined1 *local_a0;
  Error **local_98;
  undefined1 *local_90;
  Error **local_88;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_80;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_70;
  Error **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_50;
  undefined8 local_48;
  undefined1 *local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_38;
  undefined8 local_30;
  undefined1 *local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  Error::Error(__return_storage_ptr__);
  Address::Address((Address *)local_310);
  lVar2 = std::__cxx11::string::find((char)aStr,0x2f);
  if (lVar2 == -1) {
    Ipv6PrefixFromString::anon_class_1_0_00000001::operator()(&local_36a);
    local_178 = &local_368;
    local_180 = &local_369;
    bVar5 = ::fmt::v10::operator()(local_180);
    local_360 = (char *)bVar5.size_;
    local_368 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar5.data_;
    ::fmt::v10::detail::
    check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
              ();
    local_188 = &local_358;
    local_198 = local_368;
    pcStack_190 = local_360;
    local_140 = &local_198;
    local_1b0 = local_368;
    local_1a8 = local_360;
    local_1a0 = aStr;
    local_138 = local_1b0;
    pcStack_130 = local_1a8;
    local_1d8[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                             ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)aStr,(v10 *)local_188,local_368);
    local_c0 = local_1c0;
    local_c8 = local_1d8;
    local_18 = 0xd;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_c8;
    fmt.size_ = 0xd;
    fmt.data_ = local_1a8;
    local_70 = local_c8;
    local_20 = local_c8;
    local_10 = local_c0;
    ::fmt::v10::vformat_abi_cxx11_(&local_358,(v10 *)local_1b0,fmt,args);
    Error::Error(&local_338,kInvalidArgs,&local_358);
    Error::operator=(__return_storage_ptr__,&local_338);
    Error::~Error(&local_338);
    std::__cxx11::string::~string((string *)&local_358);
  }
  else {
    local_388 = (char *)0x0;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)aStr);
    addr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)strtoull(pcVar3,&local_388,0);
    pcVar3 = local_388;
    if ((local_388 == (char *)0x0) ||
       (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)aStr), pcVar3 <= pcVar4)) {
      Ipv6PrefixFromString::anon_class_1_0_00000001::operator()(&local_3e2);
      local_168 = &local_3e0;
      local_170 = &local_3e1;
      bVar5 = ::fmt::v10::operator()(local_170);
      local_3d8 = (char *)bVar5.size_;
      local_3e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar5.data_;
      ::fmt::v10::detail::
      check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                ();
      local_1e0 = &local_3d0;
      local_1f0 = local_3e0;
      pcStack_1e8 = local_3d8;
      local_120 = &local_1f0;
      local_208 = local_3e0;
      local_200 = local_3d8;
      local_1f8 = aStr;
      local_118 = local_208;
      pcStack_110 = local_200;
      local_228[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)aStr,(v10 *)local_1e0,local_3e0);
      local_b0 = local_218;
      local_b8 = local_228;
      local_30 = 0xd;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_b8;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = local_200;
      local_78 = local_b8;
      local_38 = local_b8;
      local_28 = local_b0;
      ::fmt::v10::vformat_abi_cxx11_(&local_3d0,(v10 *)local_208,fmt_00,args_00);
      Error::Error(&local_3b0,kInvalidArgs,&local_3d0);
      Error::operator=(__return_storage_ptr__,&local_3b0);
      Error::~Error(&local_3b0);
      std::__cxx11::string::~string((string *)&local_3d0);
    }
    else if (addr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage < (pointer)0x81) {
      addr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)addr.mBytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage >> 3);
      std::__cxx11::string::substr((ulong)&local_490,(ulong)aStr);
      Address::Set(&local_470,(Address *)local_310,&local_490);
      aError = Error::operator=(__return_storage_ptr__,&local_470);
      local_494 = kNone;
      bVar1 = operator!=(aError,&local_494);
      Error::~Error(&local_470);
      std::__cxx11::string::~string((string *)&local_490);
      if (!bVar1) {
        bVar1 = Address::IsIpv6((Address *)local_310);
        if (bVar1) {
          __x = Address::GetRaw((Address *)local_310);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(aPrefix,__x);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (aPrefix,(size_type)
                             addr.mBytes.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          Ipv6PrefixFromString::anon_class_1_0_00000001::operator()(&local_4f2);
          local_148 = &local_4f0;
          local_150 = &local_4f1;
          bVar5 = ::fmt::v10::operator()(local_150);
          local_4e8 = (char *)bVar5.size_;
          local_4f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      bVar5.data_;
          ::fmt::v10::detail::
          check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                    ();
          local_280 = &local_4e0;
          local_290 = local_4f0;
          pcStack_288 = local_4e8;
          local_e0 = &local_290;
          local_2a8 = local_4f0;
          local_2a0 = local_4e8;
          local_298 = aStr;
          local_d8 = local_2a8;
          pcStack_d0 = local_2a0;
          error = (Error *)::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                     ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)aStr,(v10 *)local_280,local_4f0);
          local_90 = local_2b8;
          local_98 = &error;
          local_60 = 0xd;
          args_02.field_1.values_ = in_R9.values_;
          args_02.desc_ = (unsigned_long_long)local_98;
          fmt_02.size_ = 0xd;
          fmt_02.data_ = local_2a0;
          local_88 = local_98;
          local_68 = local_98;
          local_58 = local_90;
          ::fmt::v10::vformat_abi_cxx11_(&local_4e0,(v10 *)local_2a8,fmt_02,args_02);
          Error::Error(&local_4c0,kInvalidArgs,&local_4e0);
          Error::operator=(__return_storage_ptr__,&local_4c0);
          Error::~Error(&local_4c0);
          std::__cxx11::string::~string((string *)&local_4e0);
        }
      }
    }
    else {
      Ipv6PrefixFromString::anon_class_1_0_00000001::operator()(&local_442);
      local_158 = &local_440;
      local_160 = &local_441;
      bVar5 = ::fmt::v10::operator()(local_160);
      local_438 = (char *)bVar5.size_;
      local_440 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar5.data_;
      ::fmt::v10::detail::
      check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                ();
      local_230 = &local_430;
      local_240 = local_440;
      pcStack_238 = local_438;
      local_100 = &local_240;
      local_258 = local_440;
      local_250 = local_438;
      local_248 = aStr;
      local_f8 = local_258;
      pcStack_f0 = local_250;
      local_278[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)aStr,(v10 *)local_230,local_440);
      local_a0 = local_268;
      local_a8 = local_278;
      local_48 = 0xd;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)local_a8;
      fmt_01.size_ = 0xd;
      fmt_01.data_ = local_250;
      local_80 = local_a8;
      local_50 = local_a8;
      local_40 = local_a0;
      ::fmt::v10::vformat_abi_cxx11_(&local_430,(v10 *)local_258,fmt_01,args_01);
      Error::Error(&local_410,kInvalidArgs,&local_430);
      Error::operator=(__return_storage_ptr__,&local_410);
      Error::~Error(&local_410);
      std::__cxx11::string::~string((string *)&local_430);
    }
  }
  Address::~Address((Address *)local_310);
  return __return_storage_ptr__;
}

Assistant:

Error Ipv6PrefixFromString(ByteArray &aPrefix, const std::string &aStr)
{
    Error   error;
    size_t  slash;
    size_t  prefixLength;
    Address addr;

    slash = aStr.find('/');
    VerifyOrExit(slash != std::string::npos, error = ERROR_INVALID_ARGS("{} is not a valid IPv6 prefix", aStr));

    {
        char *endPtr = nullptr;
        prefixLength = strtoull(&aStr[slash + 1], &endPtr, 0);
        VerifyOrExit(endPtr != nullptr && endPtr > &aStr[slash + 1],
                     error = ERROR_INVALID_ARGS("{} is not a valid IPv6 prefix", aStr));
        VerifyOrExit(prefixLength <= 128, error = ERROR_INVALID_ARGS("{} is not a valid IPv6 prefix", aStr));
        prefixLength /= 8;
    }

    SuccessOrExit(error = addr.Set(aStr.substr(0, slash)));
    VerifyOrExit(addr.IsIpv6(), error = ERROR_INVALID_ARGS("{} is not a valid IPv6 prefix", aStr));

    aPrefix = addr.GetRaw();
    aPrefix.resize(prefixLength);

exit:
    return error;
}